

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

int __thiscall google::protobuf::FileDescriptorProto::ByteSize(FileDescriptorProto *this)

{
  string *psVar1;
  void *pvVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  FileOptions *this_00;
  SourceCodeInfo *this_01;
  long lVar12;
  
  uVar6 = this->_has_bits_[0];
  iVar4 = 0;
  if ((char)uVar6 != '\0') {
    if ((uVar6 & 1) != 0) {
      psVar1 = this->name_;
      uVar11 = (uint)psVar1->_M_string_length;
      iVar4 = 1;
      if (0x7f < uVar11) {
        iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar11);
        uVar11 = (uint)psVar1->_M_string_length;
        uVar6 = this->_has_bits_[0];
      }
      iVar4 = uVar11 + iVar4 + 1;
    }
    if ((uVar6 & 2) != 0) {
      psVar1 = this->package_;
      uVar11 = (uint)psVar1->_M_string_length;
      iVar5 = 1;
      if (0x7f < uVar11) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar11);
        uVar11 = (uint)psVar1->_M_string_length;
        uVar6 = this->_has_bits_[0];
      }
      iVar4 = iVar4 + uVar11 + iVar5 + 1;
    }
  }
  if ((uVar6 & 0x1fe00) != 0) {
    if ((uVar6 >> 9 & 1) != 0) {
      this_00 = this->options_;
      if (this_00 == (FileOptions *)0x0) {
        this_00 = *(FileOptions **)(default_instance_ + 0xb8);
      }
      uVar6 = FileOptions::ByteSize(this_00);
      iVar5 = 1;
      if (0x7f < uVar6) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
      }
      iVar4 = iVar4 + uVar6 + iVar5 + 1;
      uVar6 = this->_has_bits_[0];
    }
    if ((uVar6 >> 10 & 1) != 0) {
      this_01 = this->source_code_info_;
      if (this_01 == (SourceCodeInfo *)0x0) {
        this_01 = *(SourceCodeInfo **)(default_instance_ + 0xc0);
      }
      uVar6 = SourceCodeInfo::ByteSize(this_01);
      iVar5 = 1;
      if (0x7f < uVar6) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
      }
      iVar4 = iVar4 + uVar6 + iVar5 + 1;
    }
  }
  iVar5 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar5;
  if (0 < iVar5) {
    lVar12 = 0;
    do {
      pvVar2 = (this->dependency_).super_RepeatedPtrFieldBase.elements_[lVar12];
      uVar6 = *(uint *)((long)pvVar2 + 8);
      iVar7 = 1;
      if (0x7f < uVar6) {
        iVar7 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
        uVar6 = *(uint *)((long)pvVar2 + 8);
        iVar5 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
      }
      iVar4 = iVar4 + iVar7 + uVar6;
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar5);
  }
  iVar5 = (this->public_dependency_).current_size_;
  iVar7 = 0;
  if (iVar5 < 1) {
    iVar10 = 0;
  }
  else {
    lVar12 = 0;
    iVar10 = 0;
    do {
      uVar6 = (this->public_dependency_).elements_[lVar12];
      if ((int)uVar6 < 0) {
        iVar8 = 10;
      }
      else {
        iVar8 = 1;
        if (0x7f < uVar6) {
          iVar8 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
          iVar5 = (this->public_dependency_).current_size_;
        }
      }
      iVar10 = iVar10 + iVar8;
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar5);
  }
  iVar8 = (this->weak_dependency_).current_size_;
  if (0 < iVar8) {
    lVar12 = 0;
    iVar7 = 0;
    do {
      uVar6 = (this->weak_dependency_).elements_[lVar12];
      if ((int)uVar6 < 0) {
        iVar9 = 10;
      }
      else {
        iVar9 = 1;
        if (0x7f < uVar6) {
          iVar9 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
          iVar8 = (this->weak_dependency_).current_size_;
        }
      }
      iVar7 = iVar7 + iVar9;
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar8);
  }
  iVar9 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar10 + iVar4 + iVar5 + iVar7 + iVar8 + iVar9;
  if (0 < iVar9) {
    lVar12 = 0;
    do {
      uVar6 = DescriptorProto::ByteSize
                        ((DescriptorProto *)
                         (this->message_type_).super_RepeatedPtrFieldBase.elements_[lVar12]);
      iVar5 = 1;
      if (0x7f < uVar6) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
      }
      iVar4 = iVar4 + uVar6 + iVar5;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->message_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar5 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar5;
  if (0 < iVar5) {
    lVar12 = 0;
    do {
      uVar6 = EnumDescriptorProto::ByteSize
                        ((EnumDescriptorProto *)
                         (this->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar12]);
      iVar5 = 1;
      if (0x7f < uVar6) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
      }
      iVar4 = iVar4 + uVar6 + iVar5;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar5 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar5;
  if (0 < iVar5) {
    lVar12 = 0;
    do {
      uVar6 = ServiceDescriptorProto::ByteSize
                        ((ServiceDescriptorProto *)
                         (this->service_).super_RepeatedPtrFieldBase.elements_[lVar12]);
      iVar5 = 1;
      if (0x7f < uVar6) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
      }
      iVar4 = iVar4 + uVar6 + iVar5;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->service_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar5 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar5;
  if (0 < iVar5) {
    lVar12 = 0;
    do {
      uVar6 = FieldDescriptorProto::ByteSize
                        ((FieldDescriptorProto *)
                         (this->extension_).super_RepeatedPtrFieldBase.elements_[lVar12]);
      iVar5 = 1;
      if (0x7f < uVar6) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
      }
      iVar4 = iVar4 + uVar6 + iVar5;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  pvVar3 = (this->_unknown_fields_).fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar5 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar4 = iVar4 + iVar5;
  }
  this->_cached_size_ = iVar4;
  return iVar4;
}

Assistant:

int FileDescriptorProto::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional string package = 2;
    if (has_package()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->package());
    }

  }
  if (_has_bits_[9 / 32] & (0xffu << (9 % 32))) {
    // optional .google.protobuf.FileOptions options = 8;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->options());
    }

    // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
    if (has_source_code_info()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->source_code_info());
    }

  }
  // repeated string dependency = 3;
  total_size += 1 * this->dependency_size();
  for (int i = 0; i < this->dependency_size(); i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->dependency(i));
  }

  // repeated int32 public_dependency = 10;
  {
    int data_size = 0;
    for (int i = 0; i < this->public_dependency_size(); i++) {
      data_size += ::google::protobuf::internal::WireFormatLite::
        Int32Size(this->public_dependency(i));
    }
    total_size += 1 * this->public_dependency_size() + data_size;
  }

  // repeated int32 weak_dependency = 11;
  {
    int data_size = 0;
    for (int i = 0; i < this->weak_dependency_size(); i++) {
      data_size += ::google::protobuf::internal::WireFormatLite::
        Int32Size(this->weak_dependency(i));
    }
    total_size += 1 * this->weak_dependency_size() + data_size;
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  total_size += 1 * this->message_type_size();
  for (int i = 0; i < this->message_type_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->message_type(i));
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  total_size += 1 * this->enum_type_size();
  for (int i = 0; i < this->enum_type_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->enum_type(i));
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  total_size += 1 * this->service_size();
  for (int i = 0; i < this->service_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->service(i));
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  total_size += 1 * this->extension_size();
  for (int i = 0; i < this->extension_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->extension(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}